

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatTypeRAW.cpp
# Opt level: O2

void __thiscall FormatTypeRAW::HandleOOB(FormatTypeRAW *this,uchar *buffer,int *pos)

{
  uchar uVar1;
  int iVar2;
  unsigned_short uVar3;
  unsigned_long uVar4;
  unsigned_long uVar5;
  unsigned_long uVar6;
  char *pcVar7;
  ulong uVar8;
  int size;
  FormatTypeRAW *this_00;
  uint uVar9;
  ulong uVar11;
  IndexElement element;
  char buffer_1 [256];
  value_type local_134;
  char local_128 [256];
  ulong uVar10;
  
  this->stream_position_ = this->stream_position_ + 1;
  iVar2 = *pos;
  *pos = iVar2 + 1;
  uVar1 = buffer[iVar2];
  uVar3 = GetWFromBuffer(this,buffer,pos);
  this->stream_position_ = this->stream_position_ - 3;
  switch(uVar1) {
  case '\x01':
  case '\x03':
    GetDWFromBuffer(this,buffer,pos);
    GetDWFromBuffer(this,buffer,pos);
    this->stream_position_ = this->stream_position_ - 8;
    break;
  case '\x02':
    uVar4 = GetDWFromBuffer(this,buffer,pos);
    uVar5 = GetDWFromBuffer(this,buffer,pos);
    uVar6 = GetDWFromBuffer(this,buffer,pos);
    uVar9 = this->stream_position_ - 0xc;
    uVar10 = (ulong)uVar9;
    this->stream_position_ = uVar9;
    local_134.index_clock = (uint)uVar6;
    local_134.stream_position = (uint)uVar4;
    local_134.flux_value = (uint)uVar5;
    if (this->last_stream_index_position_ == 0) {
      pcVar7 = "Index %i found at pos : %i - Pos in file : %i - Sample counter : %i";
      uVar8 = uVar4 & 0xffffffff;
      uVar11 = uVar5 & 0xffffffff;
    }
    else {
      uVar8 = (ulong)(local_134.index_clock - this->last_stream_index_count_);
      uVar11 = (ulong)(local_134.stream_position - this->last_stream_index_position_);
      pcVar7 = 
      "Index found at pos : %i - Diff with last : %i - Pos in file : %i - Diff with last : %i - Sample counter : %i"
      ;
      uVar10 = uVar4 & 0xffffffff;
    }
    sprintf(local_128,pcVar7,uVar6 & 0xffffffff,uVar8,uVar10,uVar11);
    this->last_stream_index_position_ = local_134.stream_position;
    this->last_stream_index_count_ = local_134.index_clock;
    std::vector<FormatTypeRAW::IndexElement,_std::allocator<FormatTypeRAW::IndexElement>_>::
    push_back(&this->index_list_,&local_134);
    break;
  case '\x04':
    this_00 = (FormatTypeRAW *)(ulong)uVar3;
    pcVar7 = (char *)operator_new__((ulong)this_00);
    ReadASCIIFromBuffer(this_00,buffer,pos,pcVar7,(uint)uVar3);
    HandleHWInfo(this,pcVar7,size);
    operator_delete__(pcVar7);
    return;
  default:
    if (uVar1 == '\r') {
      this->finished_ = true;
    }
  }
  return;
}

Assistant:

void FormatTypeRAW::HandleOOB(const unsigned char* buffer, int& pos)
{
   char type;
   unsigned short size;

   type = GetFromBuffer(buffer, pos);
   size = GetWFromBuffer(buffer, pos);
   stream_position_ -= 3;

   switch (type)
   {
   case 0x00: // Invalid O_OB
      {
         //      LOG(_T("ERROR : INVALID O_OB !"));
         //      LOGEOL;
         //m_bFinished = true;
         break;
      }
   case 0x01:
      {
         // size should be 8
         // Use it for check ?
         unsigned int stream_pos = GetDWFromBuffer(buffer, pos);
         unsigned int transfert_time = GetDWFromBuffer(buffer, pos);
         stream_position_ -= 8;
         if (stream_position_ != stream_pos)
         {
            int dbg = 1;
         }
         break;
      }

   case 0x02: // Index signal data
      {
         // size should be 0x0C - TOCHECK ?
         unsigned int streamPos = GetDWFromBuffer(buffer, pos);
         unsigned int sampleCounter = GetDWFromBuffer(buffer, pos);
         unsigned int indexCounter = GetDWFromBuffer(buffer, pos);
         stream_position_ -= 12;
         char buffer[256];
         if (last_stream_index_position_ == 0)
         {
            sprintf(buffer, "Index %i found at pos : %i - Pos in file : %i - Sample counter : %i", indexCounter,
                    streamPos, stream_position_, sampleCounter);
         }
         else
         {
            sprintf(buffer,
                    "Index found at pos : %i - Diff with last : %i - Pos in file : %i - Diff with last : %i - Sample counter : %i",
                    indexCounter, indexCounter - last_stream_index_count_, streamPos,
                    streamPos - last_stream_index_position_, sampleCounter);
         }
         last_stream_index_position_ = streamPos;
         last_stream_index_count_ = indexCounter;
         /*LOG(buffer);
         LOGEOL;*/
         IndexElement element;

         element.flux_value = sampleCounter;
         element.index_clock = indexCounter;
         element.stream_position = streamPos;


         index_list_.push_back(element);

         break;
      }

   case 0x03: // No more flux to transfer (one per track)
      {
         // size should be 8 - TOCHECK ?
         unsigned int stream_pos = GetDWFromBuffer(buffer, pos);
         unsigned int result_code = GetDWFromBuffer(buffer, pos);
         stream_position_ -= 8;
         if (stream_position_ != stream_pos)
         {
            /*LOGEOL
            LOG(_T("Stream position error.... "));
            LOGEOL*/
         }
         break;
      }
   case 0x04: // HW Information from KryoFlux device
      {
         char* info = new char[size];

         ReadASCIIFromBuffer(buffer, pos, info, size);
         OutputDebugString(info);
         OutputDebugString("\n");
         // Handle it
         HandleHWInfo(info, size);
         delete[]info;

         break;
      }
   case 0xD: // End of file (no more data to process)
      finished_ = true;
      break;
   default:
      // ERROR !
      break;
   }
}